

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDateTime __thiscall QDateTime::addMSecs(QDateTime *this,qint64 msecs)

{
  ulong uVar1;
  long in_RDX;
  uint uVar2;
  qint64 qVar3;
  
  uVar1 = *(ulong *)msecs;
  if ((uVar1 & 1) == 0) {
    uVar1 = (ulong)*(uint *)(uVar1 + 4);
  }
  if ((uVar1 & 8) == 0) {
    QDateTime(this);
    return (QDateTime)(Data)this;
  }
  (this->d).d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime(this,(QDateTime *)msecs);
  uVar1 = *(ulong *)msecs;
  if ((uVar1 & 1) == 0) {
    uVar2 = *(uint *)(uVar1 + 4);
  }
  else {
    uVar2 = (uint)uVar1;
  }
  if ((uVar2 >> 4 & 3) - 1 < 2) {
    if ((uVar1 & 1) == 0) {
      qVar3 = in_RDX + *(long *)(uVar1 + 8);
      if (SCARRY8(in_RDX,*(long *)(uVar1 + 8))) goto LAB_003100d5;
    }
    else {
      qVar3 = ((long)uVar1 >> 8) + in_RDX;
      if (SCARRY8((long)uVar1 >> 8,in_RDX)) goto LAB_003100d5;
      if (qVar3 + 0x80000000000000U >> 0x38 == 0) {
        (this->d).d = (QDateTimePrivate *)(qVar3 * 0x100 | (ulong)*(byte *)&this->d);
        return (QDateTime)(Data)this;
      }
    }
    Data::detach((Data *)this);
    ((this->d).d)->m_msecs = qVar3;
  }
  else {
    qVar3 = toMSecsSinceEpoch((QDateTime *)msecs);
    if (!SCARRY8(qVar3,in_RDX)) {
      setMSecsSinceEpoch(this,qVar3 + in_RDX);
      return (QDateTime)(Data)this;
    }
LAB_003100d5:
    Data::invalidate((Data *)this);
  }
  return (QDateTime)(Data)this;
}

Assistant:

QDateTime QDateTime::addMSecs(qint64 msecs) const
{
    if (!isValid())
        return QDateTime();

    QDateTime dt(*this);
    switch (getSpec(d)) {
    case Qt::LocalTime:
    case Qt::TimeZone:
        // Convert to real UTC first in case this crosses a DST transition:
        if (!qAddOverflow(toMSecsSinceEpoch(), msecs, &msecs))
            dt.setMSecsSinceEpoch(msecs);
        else
            dt.d.invalidate();
        break;
    case Qt::UTC:
    case Qt::OffsetFromUTC:
        // No need to convert, just add on
        if (qAddOverflow(getMSecs(d), msecs, &msecs)) {
            dt.d.invalidate();
        } else if (d.isShort() && msecsCanBeSmall(msecs)) {
            dt.d.data.msecs = qintptr(msecs);
        } else {
            dt.d.detach();
            dt.d->m_msecs = msecs;
        }
        break;
    }
    return dt;
}